

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

void __thiscall bloaty::CustomDataSource::~CustomDataSource(CustomDataSource *this)

{
  ~CustomDataSource(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

CustomDataSource::~CustomDataSource() {
  // @@protoc_insertion_point(destructor:bloaty.CustomDataSource)
  SharedDtor();
}